

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.h
# Opt level: O0

void StrToInts(int *pInts,int Num,char *pStr)

{
  long in_RDX;
  int in_ESI;
  uint *in_RDI;
  long in_FS_OFFSET;
  bool bVar1;
  int c;
  int Index;
  char aBuf [4];
  int local_30;
  int local_2c;
  int local_1c;
  uint *local_18;
  char local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  local_18 = in_RDI;
  for (local_1c = in_ESI; local_1c != 0; local_1c = local_1c + -1) {
    memset(local_c,0,4);
    local_30 = 0;
    while( true ) {
      bVar1 = false;
      if (local_30 < 4) {
        bVar1 = *(char *)(in_RDX + local_2c) != '\0';
      }
      if (!bVar1) break;
      local_c[local_30] = *(char *)(in_RDX + local_2c);
      local_30 = local_30 + 1;
      local_2c = local_2c + 1;
    }
    *local_18 = (local_c[0] + 0x80) * 0x1000000 | (local_c[1] + 0x80) * 0x10000 |
                (local_c[2] + 0x80) * 0x100 | (int)local_c[3] + 0x80U;
    local_18 = local_18 + 1;
  }
  local_18[-1] = local_18[-1] & 0xffffff00;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void StrToInts(int *pInts, int Num, const char *pStr)
{
	int Index = 0;
	while(Num)
	{
		char aBuf[4] = {0,0,0,0};
		for(int c = 0; c < 4 && pStr[Index]; c++, Index++)
			aBuf[c] = pStr[Index];
		*pInts = ((aBuf[0]+128)<<24)|((aBuf[1]+128)<<16)|((aBuf[2]+128)<<8)|(aBuf[3]+128);
		pInts++;
		Num--;
	}

	// null terminate
	pInts[-1] &= 0xffffff00;
}